

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O2

void __thiscall OpenMD::Inversion::~Inversion(Inversion *this)

{
  ~Inversion(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

RealType getValue(int snapshotNo) {
      // In OpenMD's version of an inversion, the central atom
      // comes first.  However, to get the planarity in a typical cosine
      // version of this potential (i.e. Amber-style), the central atom
      // is treated as atom *3* in a standard torsion form:

      Vector3d pos1 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r31 = pos1 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r31);
      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A = cross(r31, r43);
      Vector3d B = cross(r43, r23);

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }